

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dimacs.h
# Opt level: O0

void Glucose::parse_DIMACS<Glucose::MultiSolvers>(gzFile input_stream,MultiSolvers *S)

{
  StreamBuffer in;
  gzFile in_stack_ffffffffffefffd8;
  StreamBuffer *in_stack_ffffffffffefffe0;
  MultiSolvers *in_stack_fffffffffff00028;
  StreamBuffer *in_stack_fffffffffff00030;
  
  StreamBuffer::StreamBuffer(in_stack_ffffffffffefffe0,in_stack_ffffffffffefffd8);
  parse_DIMACS_main<Glucose::StreamBuffer,Glucose::MultiSolvers>
            (in_stack_fffffffffff00030,in_stack_fffffffffff00028);
  return;
}

Assistant:

static void parse_DIMACS(gzFile input_stream, Solver& S) {
    StreamBuffer in(input_stream);
    parse_DIMACS_main(in, S); }